

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<QtPromise::QPromiseUndefinedException>
          (PromiseError *this,QPromiseUndefinedException *value)

{
  QPromiseUndefinedException *this_00;
  QPromiseUndefinedException *value_local;
  PromiseError *this_local;
  
  std::__exception_ptr::exception_ptr::exception_ptr(&this->m_data);
  this_00 = (QPromiseUndefinedException *)__cxa_allocate_exception(8);
  QtPromise::QPromiseUndefinedException::QPromiseUndefinedException(this_00,value);
  __cxa_throw(this_00,&QtPromise::QPromiseUndefinedException::typeinfo,
              QtPromise::QPromiseUndefinedException::~QPromiseUndefinedException);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }